

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

const_iterator __thiscall Json::Value::end(Value *this)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  const_iterator cVar2;
  ValueConstIterator local_18;
  iterator local_8;
  
  if ((this->value_).map_ == (ObjectValues *)0x0 || ((uint)this->bits_ & 0xfe) != 6) {
    ValueConstIterator::ValueConstIterator(&local_18);
    uVar1 = extraout_RDX;
  }
  else {
    local_8._M_node = &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    ValueConstIterator::ValueConstIterator(&local_18,&local_8);
    uVar1 = extraout_RDX_00;
  }
  cVar2.super_ValueIteratorBase._9_7_ = (undefined7)((ulong)uVar1 >> 8);
  cVar2.super_ValueIteratorBase.isNull_ = local_18.super_ValueIteratorBase.isNull_;
  cVar2.super_ValueIteratorBase.current_._M_node = local_18.super_ValueIteratorBase.current_._M_node
  ;
  return (const_iterator)cVar2.super_ValueIteratorBase;
}

Assistant:

Value::const_iterator Value::end() const {
  switch (type()) {
  case arrayValue:
  case objectValue:
    if (value_.map_)
      return const_iterator(value_.map_->end());
    break;
  default:
    break;
  }
  return {};
}